

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>_>
::rehash(sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>
  *pSVar1;
  EntryPointer begin;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  EntryPointer psVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int8_t iVar31;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  *result;
  size_t sVar32;
  ulong uVar33;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  *psVar34;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  *psVar35;
  long lVar36;
  byte bVar37;
  anon_union_24_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_3
  *key;
  ulong uVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar64;
  int iVar65;
  undefined1 auVar62 [16];
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ulong local_38;
  
  auVar41._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar41._8_4_ = (int)(this->num_elements >> 0x20);
  auVar41._12_4_ = 0x45300000;
  auVar42._0_8_ = (double)this->_max_load_factor;
  auVar42._8_8_ = 0;
  dVar39 = ceil(((auVar41._8_8_ - 1.9342813113834067e+25) + (auVar41._0_8_ - 4503599627370496.0)) /
                auVar42._0_8_);
  local_38 = (long)(dVar39 - 9.223372036854776e+18) & (long)dVar39 >> 0x3f | (long)dVar39;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar31 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar32 = this->num_slots_minus_one;
  if (sVar32 != 0) {
    sVar32 = sVar32 + 1;
  }
  if (local_38 != sVar32) {
    uVar33 = local_38 >> 1 | local_38;
    uVar33 = uVar33 >> 2 | uVar33;
    uVar33 = uVar33 >> 4 | uVar33;
    uVar33 = uVar33 >> 8 | uVar33;
    uVar33 = uVar33 >> 0x10 | uVar33;
    uVar33 = uVar33 >> 0x20 | uVar33;
    bVar37 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar33 - (uVar33 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar37 = log2(unsigned_long)::table[(uVar33 - (uVar33 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    uVar33 = local_38 + bVar37;
    pSVar1 = (this->
             super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>
             ).storage;
    psVar34 = pSVar1->ptr;
    if (4U - ((long)psVar34 - (long)pSVar1 >> 5) < uVar33) {
      psVar34 = (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                 *)operator_new(uVar33 * 0x20);
    }
    else {
      pSVar1->ptr = psVar34 + uVar33;
    }
    auVar30 = _DAT_003e7450;
    auVar29 = _DAT_003e7440;
    auVar28 = _DAT_003e7430;
    auVar27 = _DAT_003e7420;
    auVar26 = _DAT_003e7410;
    auVar25 = _DAT_003e7400;
    auVar41 = _DAT_003e64d0;
    if (psVar34 != psVar34 + local_38 + ((ulong)bVar37 - 1)) {
      uVar38 = bVar37 + local_38 + 0x7fffffffffffffe;
      uVar33 = uVar38 & 0x7ffffffffffffff;
      auVar40._8_4_ = (int)uVar33;
      auVar40._0_8_ = uVar33;
      auVar40._12_4_ = (int)(uVar33 >> 0x20);
      psVar35 = psVar34 + 0xf;
      lVar36 = 0;
      do {
        auVar59._8_4_ = (int)lVar36;
        auVar59._0_8_ = lVar36;
        auVar59._12_4_ = (int)((ulong)lVar36 >> 0x20);
        auVar62 = auVar40 ^ auVar41;
        auVar67 = (auVar59 | auVar30) ^ auVar41;
        iVar61 = auVar62._0_4_;
        iVar80 = -(uint)(iVar61 < auVar67._0_4_);
        iVar64 = auVar62._4_4_;
        auVar69._4_4_ = -(uint)(iVar64 < auVar67._4_4_);
        iVar65 = auVar62._8_4_;
        iVar84 = -(uint)(iVar65 < auVar67._8_4_);
        iVar66 = auVar62._12_4_;
        auVar69._12_4_ = -(uint)(iVar66 < auVar67._12_4_);
        auVar43._4_4_ = iVar80;
        auVar43._0_4_ = iVar80;
        auVar43._8_4_ = iVar84;
        auVar43._12_4_ = iVar84;
        auVar42 = pshuflw(auVar42,auVar43,0xe8);
        auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar64);
        auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar66);
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar67 = pshuflw(in_XMM2,auVar68,0xe8);
        auVar69._0_4_ = auVar69._4_4_;
        auVar69._8_4_ = auVar69._12_4_;
        auVar43 = pshuflw(auVar42,auVar69,0xe8);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar62 = (auVar43 | auVar67 & auVar42) ^ auVar62;
        auVar42 = packssdw(auVar62,auVar62);
        if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar35[-0xf].distance_from_desired = -1;
        }
        auVar11._4_4_ = iVar80;
        auVar11._0_4_ = iVar80;
        auVar11._8_4_ = iVar84;
        auVar11._12_4_ = iVar84;
        auVar69 = auVar68 & auVar11 | auVar69;
        auVar42 = packssdw(auVar69,auVar69);
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar67,auVar42 ^ auVar67);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._0_4_ >> 8 & 1) != 0) {
          psVar35[-0xe].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | auVar29) ^ auVar41;
        auVar52._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar52._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar52._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar52._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar70._4_4_ = auVar52._0_4_;
        auVar70._0_4_ = auVar52._0_4_;
        auVar70._8_4_ = auVar52._8_4_;
        auVar70._12_4_ = auVar52._8_4_;
        iVar80 = -(uint)(auVar42._4_4_ == iVar64);
        iVar84 = -(uint)(auVar42._12_4_ == iVar66);
        auVar12._4_4_ = iVar80;
        auVar12._0_4_ = iVar80;
        auVar12._8_4_ = iVar84;
        auVar12._12_4_ = iVar84;
        auVar81._4_4_ = auVar52._4_4_;
        auVar81._0_4_ = auVar52._4_4_;
        auVar81._8_4_ = auVar52._12_4_;
        auVar81._12_4_ = auVar52._12_4_;
        auVar42 = auVar12 & auVar70 | auVar81;
        auVar42 = packssdw(auVar42,auVar42);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar2,auVar42 ^ auVar2);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
          psVar35[-0xd].distance_from_desired = -1;
        }
        auVar42 = pshufhw(auVar42,auVar70,0x84);
        auVar13._4_4_ = iVar80;
        auVar13._0_4_ = iVar80;
        auVar13._8_4_ = iVar84;
        auVar13._12_4_ = iVar84;
        auVar43 = pshufhw(auVar52,auVar13,0x84);
        auVar62 = pshufhw(auVar42,auVar81,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar62 | auVar43 & auVar42) ^ auVar44;
        auVar42 = packssdw(auVar44,auVar44);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._0_4_ >> 0x18 & 1) != 0) {
          psVar35[-0xc].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | auVar28) ^ auVar41;
        auVar53._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar53._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar53._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar53._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar14._4_4_ = auVar53._0_4_;
        auVar14._0_4_ = auVar53._0_4_;
        auVar14._8_4_ = auVar53._8_4_;
        auVar14._12_4_ = auVar53._8_4_;
        auVar43 = pshuflw(auVar81,auVar14,0xe8);
        auVar45._0_4_ = -(uint)(auVar42._0_4_ == iVar61);
        auVar45._4_4_ = -(uint)(auVar42._4_4_ == iVar64);
        auVar45._8_4_ = -(uint)(auVar42._8_4_ == iVar65);
        auVar45._12_4_ = -(uint)(auVar42._12_4_ == iVar66);
        auVar71._4_4_ = auVar45._4_4_;
        auVar71._0_4_ = auVar45._4_4_;
        auVar71._8_4_ = auVar45._12_4_;
        auVar71._12_4_ = auVar45._12_4_;
        auVar42 = pshuflw(auVar45,auVar71,0xe8);
        auVar72._4_4_ = auVar53._4_4_;
        auVar72._0_4_ = auVar53._4_4_;
        auVar72._8_4_ = auVar53._12_4_;
        auVar72._12_4_ = auVar53._12_4_;
        auVar62 = pshuflw(auVar53,auVar72,0xe8);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 & auVar43,(auVar62 | auVar42 & auVar43) ^ auVar3);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar35[-0xb].distance_from_desired = -1;
        }
        auVar15._4_4_ = auVar53._0_4_;
        auVar15._0_4_ = auVar53._0_4_;
        auVar15._8_4_ = auVar53._8_4_;
        auVar15._12_4_ = auVar53._8_4_;
        auVar72 = auVar71 & auVar15 | auVar72;
        auVar62 = packssdw(auVar72,auVar72);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42,auVar62 ^ auVar4);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._4_2_ >> 8 & 1) != 0) {
          psVar35[-10].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | auVar27) ^ auVar41;
        auVar54._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar54._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar54._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar54._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar73._4_4_ = auVar54._0_4_;
        auVar73._0_4_ = auVar54._0_4_;
        auVar73._8_4_ = auVar54._8_4_;
        auVar73._12_4_ = auVar54._8_4_;
        iVar80 = -(uint)(auVar42._4_4_ == iVar64);
        iVar84 = -(uint)(auVar42._12_4_ == iVar66);
        auVar16._4_4_ = iVar80;
        auVar16._0_4_ = iVar80;
        auVar16._8_4_ = iVar84;
        auVar16._12_4_ = iVar84;
        auVar82._4_4_ = auVar54._4_4_;
        auVar82._0_4_ = auVar54._4_4_;
        auVar82._8_4_ = auVar54._12_4_;
        auVar82._12_4_ = auVar54._12_4_;
        auVar42 = auVar16 & auVar73 | auVar82;
        auVar42 = packssdw(auVar42,auVar42);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar5,auVar42 ^ auVar5);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar35[-9].distance_from_desired = -1;
        }
        auVar42 = pshufhw(auVar42,auVar73,0x84);
        auVar17._4_4_ = iVar80;
        auVar17._0_4_ = iVar80;
        auVar17._8_4_ = iVar84;
        auVar17._12_4_ = iVar84;
        auVar43 = pshufhw(auVar54,auVar17,0x84);
        auVar62 = pshufhw(auVar42,auVar82,0x84);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar46 = (auVar62 | auVar43 & auVar42) ^ auVar46;
        auVar42 = packssdw(auVar46,auVar46);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._6_2_ >> 8 & 1) != 0) {
          psVar35[-8].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | auVar26) ^ auVar41;
        auVar55._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar55._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar55._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar55._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar18._4_4_ = auVar55._0_4_;
        auVar18._0_4_ = auVar55._0_4_;
        auVar18._8_4_ = auVar55._8_4_;
        auVar18._12_4_ = auVar55._8_4_;
        auVar43 = pshuflw(auVar82,auVar18,0xe8);
        auVar47._0_4_ = -(uint)(auVar42._0_4_ == iVar61);
        auVar47._4_4_ = -(uint)(auVar42._4_4_ == iVar64);
        auVar47._8_4_ = -(uint)(auVar42._8_4_ == iVar65);
        auVar47._12_4_ = -(uint)(auVar42._12_4_ == iVar66);
        auVar74._4_4_ = auVar47._4_4_;
        auVar74._0_4_ = auVar47._4_4_;
        auVar74._8_4_ = auVar47._12_4_;
        auVar74._12_4_ = auVar47._12_4_;
        auVar42 = pshuflw(auVar47,auVar74,0xe8);
        auVar75._4_4_ = auVar55._4_4_;
        auVar75._0_4_ = auVar55._4_4_;
        auVar75._8_4_ = auVar55._12_4_;
        auVar75._12_4_ = auVar55._12_4_;
        auVar62 = pshuflw(auVar55,auVar75,0xe8);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar62 | auVar42 & auVar43) ^ auVar56;
        auVar62 = packssdw(auVar56,auVar56);
        auVar42 = packsswb(auVar42 & auVar43,auVar62);
        if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar35[-7].distance_from_desired = -1;
        }
        auVar19._4_4_ = auVar55._0_4_;
        auVar19._0_4_ = auVar55._0_4_;
        auVar19._8_4_ = auVar55._8_4_;
        auVar19._12_4_ = auVar55._8_4_;
        auVar75 = auVar74 & auVar19 | auVar75;
        auVar62 = packssdw(auVar75,auVar75);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
        auVar42 = packsswb(auVar42,auVar62);
        if ((auVar42._8_2_ >> 8 & 1) != 0) {
          psVar35[-6].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | auVar25) ^ auVar41;
        auVar57._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar57._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar57._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar57._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar76._4_4_ = auVar57._0_4_;
        auVar76._0_4_ = auVar57._0_4_;
        auVar76._8_4_ = auVar57._8_4_;
        auVar76._12_4_ = auVar57._8_4_;
        iVar80 = -(uint)(auVar42._4_4_ == iVar64);
        iVar84 = -(uint)(auVar42._12_4_ == iVar66);
        auVar20._4_4_ = iVar80;
        auVar20._0_4_ = iVar80;
        auVar20._8_4_ = iVar84;
        auVar20._12_4_ = iVar84;
        auVar83._4_4_ = auVar57._4_4_;
        auVar83._0_4_ = auVar57._4_4_;
        auVar83._8_4_ = auVar57._12_4_;
        auVar83._12_4_ = auVar57._12_4_;
        auVar42 = auVar20 & auVar76 | auVar83;
        auVar42 = packssdw(auVar42,auVar42);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar7,auVar42 ^ auVar7);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar35[-5].distance_from_desired = -1;
        }
        auVar42 = pshufhw(auVar42,auVar76,0x84);
        auVar21._4_4_ = iVar80;
        auVar21._0_4_ = iVar80;
        auVar21._8_4_ = iVar84;
        auVar21._12_4_ = iVar84;
        auVar43 = pshufhw(auVar57,auVar21,0x84);
        auVar62 = pshufhw(auVar42,auVar83,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar62 | auVar43 & auVar42) ^ auVar48;
        auVar42 = packssdw(auVar48,auVar48);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._10_2_ >> 8 & 1) != 0) {
          psVar35[-4].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | _DAT_003e73f0) ^ auVar41;
        auVar58._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar58._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar58._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar58._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar22._4_4_ = auVar58._0_4_;
        auVar22._0_4_ = auVar58._0_4_;
        auVar22._8_4_ = auVar58._8_4_;
        auVar22._12_4_ = auVar58._8_4_;
        auVar43 = pshuflw(auVar83,auVar22,0xe8);
        auVar49._0_4_ = -(uint)(auVar42._0_4_ == iVar61);
        auVar49._4_4_ = -(uint)(auVar42._4_4_ == iVar64);
        auVar49._8_4_ = -(uint)(auVar42._8_4_ == iVar65);
        auVar49._12_4_ = -(uint)(auVar42._12_4_ == iVar66);
        auVar77._4_4_ = auVar49._4_4_;
        auVar77._0_4_ = auVar49._4_4_;
        auVar77._8_4_ = auVar49._12_4_;
        auVar77._12_4_ = auVar49._12_4_;
        auVar42 = pshuflw(auVar49,auVar77,0xe8);
        auVar78._4_4_ = auVar58._4_4_;
        auVar78._0_4_ = auVar58._4_4_;
        auVar78._8_4_ = auVar58._12_4_;
        auVar78._12_4_ = auVar58._12_4_;
        auVar62 = pshuflw(auVar58,auVar78,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 & auVar43,(auVar62 | auVar42 & auVar43) ^ auVar8);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar35[-3].distance_from_desired = -1;
        }
        auVar23._4_4_ = auVar58._0_4_;
        auVar23._0_4_ = auVar58._0_4_;
        auVar23._8_4_ = auVar58._8_4_;
        auVar23._12_4_ = auVar58._8_4_;
        auVar78 = auVar77 & auVar23 | auVar78;
        auVar62 = packssdw(auVar78,auVar78);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42,auVar62 ^ auVar9);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._12_2_ >> 8 & 1) != 0) {
          psVar35[-2].distance_from_desired = -1;
        }
        auVar42 = (auVar59 | _DAT_003e73e0) ^ auVar41;
        auVar50._0_4_ = -(uint)(iVar61 < auVar42._0_4_);
        auVar50._4_4_ = -(uint)(iVar64 < auVar42._4_4_);
        auVar50._8_4_ = -(uint)(iVar65 < auVar42._8_4_);
        auVar50._12_4_ = -(uint)(iVar66 < auVar42._12_4_);
        auVar79._4_4_ = auVar50._0_4_;
        auVar79._0_4_ = auVar50._0_4_;
        auVar79._8_4_ = auVar50._8_4_;
        auVar79._12_4_ = auVar50._8_4_;
        auVar60._4_4_ = -(uint)(auVar42._4_4_ == iVar64);
        auVar60._12_4_ = -(uint)(auVar42._12_4_ == iVar66);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar63._4_4_ = auVar50._4_4_;
        auVar63._0_4_ = auVar50._4_4_;
        auVar63._8_4_ = auVar50._12_4_;
        auVar63._12_4_ = auVar50._12_4_;
        auVar62 = auVar60 & auVar79 | auVar63;
        auVar42 = packssdw(auVar50,auVar62);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar10,auVar42 ^ auVar10);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar35[-1].distance_from_desired = -1;
        }
        auVar42 = pshufhw(auVar42,auVar79,0x84);
        in_XMM2 = pshufhw(auVar62,auVar60,0x84);
        in_XMM2 = in_XMM2 & auVar42;
        auVar42 = pshufhw(auVar42,auVar63,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar42 | in_XMM2) ^ auVar51;
        auVar42 = packssdw(auVar51,auVar51);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42._14_2_ >> 8 & 1) != 0) {
          psVar35->distance_from_desired = -1;
        }
        lVar36 = lVar36 + 0x10;
        psVar35 = psVar35 + 0x10;
      } while ((uVar33 - ((uint)uVar38 & 0xf)) + 0x10 != lVar36);
    }
    psVar34[local_38 + ((ulong)bVar37 - 1)].distance_from_desired = '\0';
    begin = this->entries;
    sVar32 = this->num_slots_minus_one;
    this->entries = psVar34;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar31;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar37;
    this->num_elements = 0;
    local_38 = sVar32;
    if (begin != begin + sVar32 + (long)max_lookups) {
      lVar36 = sVar32 * 0x20 + (long)max_lookups * 0x20;
      psVar24 = begin;
      do {
        key = &psVar24->field_1;
        if (-1 < *(char *)((long)&key[-1].value + 0x10)) {
          sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>>
          ::emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>
                    ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>>
                      *)this,&key->value);
          *(undefined1 *)((long)&key[-1].value + 0x10) = 0xff;
        }
        psVar24 = (EntryPointer)(key + 1);
        lVar36 = lVar36 + -0x20;
      } while (lVar36 != 0);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }